

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,undefined8 branchIndex,
          NoInfer<kj::ArrayPtr<const_char>_> *first,NoInfer<kj::ArrayPtr<const_char>_> *rest,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_1,NoInfer<kj::ArrayPtr<const_char>_> *rest_2,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_3,NoInfer<kj::ArrayPtr<const_char>_> *rest_4,
          NoInfer<kj::StringTree> *rest_5,NoInfer<kj::ArrayPtr<const_char>_> *rest_6,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_7,NoInfer<kj::ArrayPtr<const_char>_> *rest_8,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_9,NoInfer<kj::ArrayPtr<const_char>_> *rest_10,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_11,NoInfer<kj::ArrayPtr<const_char>_> *rest_12,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_13,NoInfer<kj::CappedArray<char,_14UL>_> *rest_14
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,NoInfer<kj::StringTree> *rest_16,
          NoInfer<kj::StringTree> *rest_17,NoInfer<kj::ArrayPtr<const_char>_> *rest_18,
          NoInfer<kj::String> *rest_19,NoInfer<kj::ArrayPtr<const_char>_> *rest_20,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_21,NoInfer<kj::ArrayPtr<const_char>_> *rest_22,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_23,NoInfer<kj::ArrayPtr<const_char>_> *rest_24,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_25,NoInfer<kj::ArrayPtr<const_char>_> *rest_26,
          NoInfer<kj::String> *rest_27,NoInfer<kj::ArrayPtr<const_char>_> *rest_28,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_29,NoInfer<kj::ArrayPtr<const_char>_> *rest_30
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_31,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,
          NoInfer<kj::StringTree> *rest_33,NoInfer<kj::ArrayPtr<const_char>_> *rest_34,
          NoInfer<kj::String> *rest_35,NoInfer<kj::ArrayPtr<const_char>_> *rest_36,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_37,NoInfer<kj::ArrayPtr<const_char>_> *rest_38,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_39,NoInfer<kj::ArrayPtr<const_char>_> *rest_40,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_41,NoInfer<kj::ArrayPtr<const_char>_> *rest_42,
          NoInfer<kj::String> *rest_43,NoInfer<kj::ArrayPtr<const_char>_> *rest_44,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_45,NoInfer<kj::ArrayPtr<const_char>_> *rest_46
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_47,NoInfer<kj::ArrayPtr<const_char>_> *rest_48,
          NoInfer<kj::StringTree> *rest_49,NoInfer<kj::StringTree> *rest_50,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_51,NoInfer<kj::ArrayPtr<const_char>_> *rest_52,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_53,NoInfer<kj::ArrayPtr<const_char>_> *rest_54,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_55,NoInfer<kj::ArrayPtr<const_char>_> *rest_56,
          NoInfer<kj::String> *rest_57,NoInfer<kj::ArrayPtr<const_char>_> *rest_58,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_59,NoInfer<kj::ArrayPtr<const_char>_> *rest_60,
          NoInfer<kj::String> *rest_61,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_63)

{
  ArrayPtr<const_char> *pAVar1;
  char *pcVar2;
  ArrayPtr<const_char> *pAVar3;
  ArrayPtr<const_char> *pAVar4;
  CappedArray<char,_14UL> *pCVar5;
  ArrayPtr<const_char> *pAVar6;
  StringTree *pSVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  ArrayPtr<const_char> *pAVar13;
  ArrayPtr<const_char> *pAVar14;
  ArrayPtr<const_char> *pAVar15;
  CappedArray<char,_14UL> *pCVar16;
  ArrayPtr<const_char> *pAVar17;
  StringTree *pSVar18;
  StringTree *pSVar19;
  ArrayPtr<const_char> *pAVar20;
  String *pSVar21;
  ArrayPtr<const_char> *pAVar22;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *pAVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  String *pSVar29;
  ArrayPtr<const_char> *pAVar30;
  CappedArray<char,_14UL> *pCVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  ArrayPtr<const_char> *pAVar34;
  StringTree *pSVar35;
  ArrayPtr<const_char> *pAVar36;
  String *pSVar37;
  ArrayPtr<const_char> *pAVar38;
  ArrayPtr<const_char> *pAVar39;
  ArrayPtr<const_char> *pAVar40;
  ArrayPtr<const_char> *pAVar41;
  ArrayPtr<const_char> *pAVar42;
  ArrayPtr<const_char> *pAVar43;
  ArrayPtr<const_char> *pAVar44;
  String *pSVar45;
  ArrayPtr<const_char> *pAVar46;
  CappedArray<char,_14UL> *pCVar47;
  ArrayPtr<const_char> *pAVar48;
  ArrayPtr<const_char> *pAVar49;
  ArrayPtr<const_char> *pAVar50;
  StringTree *pSVar51;
  StringTree *pSVar52;
  ArrayPtr<const_char> *pAVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  ArrayPtr<const_char> *pAVar57;
  ArrayPtr<const_char> *pAVar58;
  String *pSVar59;
  ArrayPtr<const_char> *pAVar60;
  ArrayPtr<const_char> *pAVar61;
  ArrayPtr<const_char> *pAVar62;
  String *pSVar63;
  ArrayPtr<const_char> *pAVar64;
  CappedArray<char,_14UL> *pCVar65;
  ArrayPtr<const_char> *pAVar66;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::StringTree> *in_stack_00000200;
  NoInfer<kj::StringTree> *in_stack_00000208;
  NoInfer<kj::StringTree> *in_stack_00000210;
  NoInfer<kj::StringTree> *in_stack_00000218;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000248;
  NoInfer<kj::String> *in_stack_00000250;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000258;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000260;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000268;
  NoInfer<kj::String> *in_stack_00000270;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000278;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000280;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000288;
  NoInfer<kj::StringTree> *in_stack_00000290;
  NoInfer<kj::StringTree> *in_stack_00000298;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a8;
  NoInfer<kj::String> *in_stack_000002b0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002b8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e8;
  NoInfer<kj::String> *in_stack_000002f0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f8;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000300;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000308;
  NoInfer<kj::StringTree> *in_stack_00000310;
  NoInfer<kj::StringTree> *in_stack_00000318;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000320;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pcVar2 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pCVar5 = fwd<kj::CappedArray<char,14ul>>(rest_3);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pSVar7 = fwd<kj::StringTree>(rest_5);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pCVar16 = fwd<kj::CappedArray<char,14ul>>(rest_14);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pSVar18 = fwd<kj::StringTree>(rest_16);
  pSVar19 = fwd<kj::StringTree>(rest_17);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pSVar21 = fwd<kj::String>(rest_19);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pSVar29 = fwd<kj::String>(rest_27);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pCVar31 = fwd<kj::CappedArray<char,14ul>>(rest_29);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pSVar35 = fwd<kj::StringTree>(rest_33);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pSVar37 = fwd<kj::String>(rest_35);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  pAVar43 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pSVar45 = fwd<kj::String>(rest_43);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pCVar47 = fwd<kj::CappedArray<char,14ul>>(rest_45);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  pSVar51 = fwd<kj::StringTree>(rest_49);
  pSVar52 = fwd<kj::StringTree>(rest_50);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pAVar57 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pSVar59 = fwd<kj::String>(rest_57);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pAVar61 = fwd<kj::ArrayPtr<char_const>>(rest_59);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pSVar63 = fwd<kj::String>(rest_61);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pCVar65 = fwd<kj::CappedArray<char,14ul>>(rest_63);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::StringTree>(in_stack_00000200);
  fwd<kj::StringTree>(in_stack_00000208);
  fwd<kj::StringTree>(in_stack_00000210);
  fwd<kj::StringTree>(in_stack_00000218);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  fwd<kj::String>(in_stack_00000250);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  fwd<kj::String>(in_stack_00000270);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000280);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  fwd<kj::StringTree>(in_stack_00000290);
  fwd<kj::StringTree>(in_stack_00000298);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a8);
  fwd<kj::String>(in_stack_000002b0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e8);
  fwd<kj::String>(in_stack_000002f0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f8);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000300);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000308);
  fwd<kj::StringTree>(in_stack_00000310);
  fwd<kj::StringTree>(in_stack_00000318);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000320);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pcVar2,branchIndex,pAVar1,pAVar3,pAVar4,pCVar5,pAVar6,pSVar7,pAVar8,pAVar9,pAVar10
             ,pAVar11,pAVar12,pAVar13,pAVar14,pAVar15,pCVar16,pAVar17,pSVar18,pSVar19,pAVar20,
             pSVar21,pAVar22,pAVar23,pAVar24,pAVar25,pAVar26,pAVar27,pAVar28,pSVar29,pAVar30,pCVar31
             ,pAVar32,pAVar33,pAVar34,pSVar35,pAVar36,pSVar37,pAVar38,pAVar39,pAVar40,pAVar41,
             pAVar42,pAVar43,pAVar44,pSVar45,pAVar46,pCVar47,pAVar48,pAVar49,pAVar50,pSVar51,pSVar52
             ,pAVar53,pAVar54,pAVar55,pAVar56,pAVar57,pAVar58,pSVar59,pAVar60,pAVar61,pAVar62,
             pSVar63,pAVar64,pCVar65,pAVar66);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}